

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::enumerateDeviceExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  string *psVar2;
  TestLog *log;
  Context *pCVar3;
  qpTestResult qVar4;
  InstanceInterface *pIVar5;
  VkPhysicalDevice pVVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  char *pcVar10;
  char *pcVar11;
  pointer pVVar12;
  ulong uVar13;
  long lVar14;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionNames;
  ScopedLogSection section;
  ScopedLogSection section_1;
  ResultCollector results;
  allocator<char> local_2c1;
  string local_2c0;
  Context *local_2a0;
  undefined1 local_298 [32];
  TestLog *local_278;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> local_270;
  TestStatus *local_258;
  pointer local_250;
  ScopedLogSection local_248;
  long *local_240;
  long local_238;
  long local_230 [2];
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  long local_200 [11];
  ios_base local_1a8 [264];
  ResultCollector local_a0;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  log = context->m_testCtx->m_log;
  local_220._0_8_ = local_220 + 0x10;
  local_258 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"");
  tcu::ResultCollector::ResultCollector(&local_a0,log,(string *)local_220);
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
  }
  local_220._0_8_ = local_220 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Global","");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Global Extensions","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_270,log,(string *)local_220,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
  }
  local_278 = log;
  pIVar5 = Context::getInstanceInterface(context);
  pVVar6 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_2c0,pIVar5,pVVar6,(char *)0x0);
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = (pointer)0x0;
  local_298._16_8_ = (pointer)0x0;
  local_2a0 = context;
  if ((pointer)local_2c0._M_string_length != local_2c0._M_dataplus._M_p) {
    poVar1 = (ostringstream *)(local_220 + 8);
    lVar14 = 0;
    uVar13 = 0;
    do {
      local_220._0_8_ = local_278;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
      ::vk::operator<<((ostream *)poVar1,
                       (VkExtensionProperties *)(local_2c0._M_dataplus._M_p + lVar14));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_220,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_1a8);
      local_220._0_8_ = local_220 + 0x10;
      pcVar11 = local_2c0._M_dataplus._M_p + lVar14;
      if (pcVar11 == (char *)0x0) {
        pcVar10 = &DAT_00000001;
      }
      else {
        sVar7 = strlen(pcVar11);
        pcVar10 = pcVar11 + sVar7;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,pcVar11,pcVar10);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x104;
    } while (uVar13 < (ulong)(((long)(local_2c0._M_string_length - (long)local_2c0._M_dataplus._M_p)
                              >> 2) * 0xfc0fc0fc0fc0fc1));
  }
  checkKhrExtensions(&local_a0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_298,7,
                     (char **)api::(anonymous_namespace)::
                              checkDeviceExtensions(tcu::ResultCollector&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                              ::s_allowedDeviceKhrExtensions);
  checkDuplicates(&local_a0,"extension",
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_298);
  local_48 = 0;
  local_40 = 0;
  psVar2 = (string *)(local_220 + 0x10);
  local_220._0_8_ = &PTR__CheckEnumerateDeviceExtensionPropertiesIncompleteResult_00ceffe0;
  local_210._M_allocated_capacity = (size_type)local_200;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char*>(psVar2,&local_40,&local_40);
  CheckIncompleteResult<vk::VkExtensionProperties>::operator()
            ((CheckIncompleteResult<vk::VkExtensionProperties> *)local_220,local_2a0,&local_a0,
             ((long)(local_2c0._M_string_length - (long)local_2c0._M_dataplus._M_p) >> 2) *
             0xfc0fc0fc0fc0fc1);
  local_220._0_8_ = &PTR__CheckEnumerateDeviceExtensionPropertiesIncompleteResult_00ceffe0;
  if ((long *)local_210._M_allocated_capacity != local_200) {
    operator_delete((void *)local_210._M_allocated_capacity,local_200[0] + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    local_2c0.field_2._M_allocated_capacity - (long)local_2c0._M_dataplus._M_p);
  }
  tcu::TestLog::endSection
            ((TestLog *)
             local_270.
             super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
             _M_impl.super__Vector_impl_data._M_start);
  pIVar5 = Context::getInstanceInterface(local_2a0);
  pVVar6 = Context::getPhysicalDevice(local_2a0);
  ::vk::enumerateDeviceLayerProperties(&local_270,pIVar5,pVVar6);
  if (local_270.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_270.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = (ostringstream *)(local_220 + 8);
    pVVar12 = local_270.
              super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_220,pVVar12->layerName,&local_2c1);
      local_298._0_8_ = local_298 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"Layer: ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)local_298);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2c0.field_2._M_allocated_capacity = *psVar9;
        local_2c0.field_2._8_8_ = plVar8[3];
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      }
      else {
        local_2c0.field_2._M_allocated_capacity = *psVar9;
        local_2c0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2c0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&local_248,local_278,(string *)local_220,&local_2c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pCVar3 = local_2a0;
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_298._16_8_)->_M_p + 1));
      }
      if ((string *)local_220._0_8_ != psVar2) {
        operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
      }
      pIVar5 = Context::getInstanceInterface(pCVar3);
      pVVar6 = Context::getPhysicalDevice(pCVar3);
      ::vk::enumerateDeviceExtensionProperties
                ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                 &local_2c0,pIVar5,pVVar6,pVVar12->layerName);
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (pointer)0x0;
      local_298._16_8_ = (pointer)0x0;
      local_250 = pVVar12;
      if ((pointer)local_2c0._M_string_length != local_2c0._M_dataplus._M_p) {
        lVar14 = 0;
        uVar13 = 0;
        do {
          local_220._0_8_ = local_278;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
          ::vk::operator<<((ostream *)poVar1,
                           (VkExtensionProperties *)(local_2c0._M_dataplus._M_p + lVar14));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_220,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_1a8);
          pcVar11 = local_2c0._M_dataplus._M_p + lVar14;
          if (pcVar11 == (char *)0x0) {
            pcVar10 = &DAT_00000001;
            local_220._0_8_ = psVar2;
          }
          else {
            local_220._0_8_ = psVar2;
            sVar7 = strlen(pcVar11);
            pcVar10 = pcVar11 + sVar7;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_220,pcVar11,pcVar10);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220)
          ;
          if ((string *)local_220._0_8_ != psVar2) {
            operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
          }
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x104;
        } while (uVar13 < (ulong)(((long)(local_2c0._M_string_length -
                                         (long)local_2c0._M_dataplus._M_p) >> 2) * 0xfc0fc0fc0fc0fc1
                                 ));
      }
      checkKhrExtensions(&local_a0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_298,7,
                         (char **)api::(anonymous_namespace)::
                                  checkDeviceExtensions(tcu::ResultCollector&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                  ::s_allowedDeviceKhrExtensions);
      checkDuplicates(&local_a0,"extension",
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,local_250->layerName,&local_2c1);
      pCVar3 = local_2a0;
      local_220._0_8_ = &PTR__CheckEnumerateDeviceExtensionPropertiesIncompleteResult_00ceffe0;
      local_210._M_allocated_capacity = (size_type)local_200;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_220 + 0x10),local_240,local_238 + (long)local_240);
      CheckIncompleteResult<vk::VkExtensionProperties>::operator()
                ((CheckIncompleteResult<vk::VkExtensionProperties> *)local_220,pCVar3,&local_a0,
                 ((long)(local_2c0._M_string_length - (long)local_2c0._M_dataplus._M_p) >> 2) *
                 0xfc0fc0fc0fc0fc1);
      local_220._0_8_ = &PTR__CheckEnumerateDeviceExtensionPropertiesIncompleteResult_00ceffe0;
      if ((long *)local_210._M_allocated_capacity != local_200) {
        operator_delete((void *)local_210._M_allocated_capacity,local_200[0] + 1);
      }
      pVVar12 = local_250;
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        local_2c0.field_2._M_allocated_capacity - (long)local_2c0._M_dataplus._M_p);
      }
      tcu::TestLog::endSection(local_248.m_log);
      pVVar12 = pVVar12 + 1;
    } while (pVVar12 !=
             local_270.
             super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_270.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.
                    super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_270.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  qVar4 = tcu::ResultCollector::getResult(&local_a0);
  local_220._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,local_a0.m_message._M_dataplus._M_p,
             local_a0.m_message._M_dataplus._M_p + local_a0.m_message._M_string_length);
  local_258->m_code = qVar4;
  (local_258->m_description)._M_dataplus._M_p = (pointer)&(local_258->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258->m_description,local_220._0_8_,
             (string *)(local_220._0_8_ + local_220._8_8_));
  if ((string *)local_220._0_8_ != psVar2) {
    operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_message._M_dataplus._M_p != &local_a0.m_message.field_2) {
    operator_delete(local_a0.m_message._M_dataplus._M_p,
                    local_a0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_prefix._M_dataplus._M_p != &local_a0.m_prefix.field_2) {
    operator_delete(local_a0.m_prefix._M_dataplus._M_p,
                    local_a0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return local_258;
}

Assistant:

tcu::TestStatus enumerateDeviceExtensions (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	{
		const ScopedLogSection				section		(log, "Global", "Global Extensions");
		const vector<VkExtensionProperties>	properties	= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL);
		vector<string>						extensionNames;

		for (size_t ndx = 0; ndx < properties.size(); ndx++)
		{
			log << TestLog::Message << ndx << ": " << properties[ndx] << TestLog::EndMessage;

			extensionNames.push_back(properties[ndx].extensionName);
		}

		checkDeviceExtensions(results, extensionNames);
		CheckEnumerateDeviceExtensionPropertiesIncompleteResult()(context, results, properties.size());
	}

	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			const ScopedLogSection				section		(log, layer->layerName, string("Layer: ") + layer->layerName);
			const vector<VkExtensionProperties>	properties	= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), layer->layerName);
			vector<string>						extensionNames;

			for (size_t extNdx = 0; extNdx < properties.size(); extNdx++)
			{
				log << TestLog::Message << extNdx << ": " << properties[extNdx] << TestLog::EndMessage;


				extensionNames.push_back(properties[extNdx].extensionName);
			}

			checkDeviceExtensions(results, extensionNames);
			CheckEnumerateDeviceExtensionPropertiesIncompleteResult(layer->layerName)(context, results, properties.size());
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}